

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectgenerator.cpp
# Opt level: O1

bool __thiscall ProjectGenerator::openOutput(ProjectGenerator *this,QFile *file,QString *build)

{
  QString file_00;
  int *piVar1;
  char16_t *pcVar2;
  bool bVar3;
  long in_FS_OFFSET;
  ProString fileName;
  undefined8 in_stack_ffffffffffffff28;
  QArrayData *pQVar4;
  undefined1 local_b8 [8];
  QString local_b0;
  undefined1 local_98 [32];
  QString *pQStack_78;
  undefined1 *local_70;
  undefined1 local_68 [28];
  int iStack_4c;
  QString *local_48;
  undefined1 *puStack_40;
  QHash<QString,_bool> local_38;
  
  local_38.d = *(Data **)(in_FS_OFFSET + 0x28);
  local_48 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_68._16_4_ = 0xaaaaaaaa;
  local_68._20_4_ = 0xaaaaaaaa;
  stack0xffffffffffffffb0 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68._0_4_ = 0xaaaaaaaa;
  local_68._4_4_ = 0xaaaaaaaa;
  local_68._8_4_ = -0x55555556;
  local_68._12_4_ = 0xaaaaaaaa;
  (**(code **)(*(long *)file + 0xe8))((QString *)local_98);
  ProString::ProString((ProString *)local_68,(QString *)local_98);
  if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
    }
  }
  bVar3 = ProString::endsWith((ProString *)local_68,&Option::pro_ext,CaseSensitive);
  pcVar2 = Option::output_dir.d.ptr;
  pQVar4 = &(Option::output_dir.d.d)->super_QArrayData;
  if (!bVar3) {
    if (iStack_4c == 0) {
      if (Option::output_dir.d.d != (Data *)0x0) {
        LOCK();
        ((Option::output_dir.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((Option::output_dir.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + 1;
        UNLOCK();
      }
      file_00.d.ptr = (char16_t *)pQVar4;
      file_00.d.d = (Data *)in_stack_ffffffffffffff28;
      file_00.d.size = (qsizetype)pcVar2;
      MakefileGenerator::fileInfo((MakefileGenerator *)local_b8,file_00);
      QFileInfo::fileName();
      ProString::ProString((ProString *)local_98,&local_b0);
      QString::operator=((QString *)local_68,(QString *)local_98);
      stack0xffffffffffffffb0 = (Data *)local_98._24_8_;
      local_48 = pQStack_78;
      puStack_40 = local_70;
      if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
        }
      }
      if ((ProString *)local_b0.d.d != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_b0.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_b0.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_b0.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,2,0x10);
        }
      }
      QFileInfo::~QFileInfo((QFileInfo *)local_b8);
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
    }
    local_b0.d.ptr = (char16_t *)&Option::pro_ext;
    local_b0.d.d = (Data *)local_68;
    QStringBuilder<ProString_&,_QString_&>::convertTo<QString>
              ((QString *)local_98,(QStringBuilder<ProString_&,_QString_&> *)&local_b0);
    QFile::setFileName((QString *)file);
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
      }
    }
  }
  bVar3 = MakefileGenerator::openOutput(&this->super_MakefileGenerator,file,build);
  piVar1 = (int *)CONCAT44(local_68._4_4_,local_68._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_68._4_4_,local_68._0_4_),2,0x10);
    }
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_38.d) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool
ProjectGenerator::openOutput(QFile &file, const QString &build) const
{
    ProString fileName = file.fileName();
    if (!fileName.endsWith(Option::pro_ext)) {
        if (fileName.isEmpty())
            fileName = fileInfo(Option::output_dir).fileName();
        file.setFileName(fileName + Option::pro_ext);
    }
    return MakefileGenerator::openOutput(file, build);
}